

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

Path * __thiscall
Map<int,_Path,_std::less<int>_>::value
          (Path *__return_storage_ptr__,Map<int,_Path,_std::less<int>_> *this,int *key,
          Path *defaultValue,bool *ok)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  
  p_Var5 = (this->super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var4 = &(this->
              super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>).
              _M_t._M_impl.super__Rb_tree_header;
    iVar1 = *key;
    p_Var2 = &p_Var4->_M_header;
    do {
      if (iVar1 <= (int)p_Var5[1]._M_color) {
        p_Var2 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar1];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && ((int)p_Var2[1]._M_color <= iVar1)) {
      if (ok != (bool *)0x0) {
        *ok = true;
      }
      defaultValue = (Path *)&p_Var2[1]._M_parent;
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
      pp_Var3 = &p_Var2[1]._M_left;
      goto LAB_001703a4;
    }
  }
  if (ok != (bool *)0x0) {
    *ok = false;
  }
  (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
  pp_Var3 = (_Base_ptr *)&(defaultValue->super_String).mString._M_string_length;
LAB_001703a4:
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(_Base_ptr *)defaultValue,
             (long)&(*(_Base_ptr *)defaultValue)->_M_color + (long)&(*pp_Var3)->_M_color);
  return __return_storage_ptr__;
}

Assistant:

Value value(const Key &key, const Value &defaultValue, bool *ok = 0) const
    {
        typename Base::const_iterator it = Base::find(key);
        if (it == Base::end()) {
            if (ok)
                *ok = false;
            return defaultValue;
        }
        if (ok)
            *ok = true;
        return it->second;
    }